

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::ParseEnum(Parser *this,bool is_union,EnumDef **dest,char *filename)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  ulong uVar5;
  EnumVal *__rhs;
  char cVar6;
  EnumDef *pEVar7;
  int iVar8;
  BaseType BVar9;
  const_iterator cVar10;
  EnumVal *pEVar11;
  StructDef *pSVar12;
  size_t sVar13;
  long *plVar14;
  Type *e;
  byte bVar15;
  size_type *psVar16;
  long *plVar17;
  size_type sVar18;
  pointer ppEVar19;
  CheckedError *ce;
  int t;
  undefined7 in_register_00000031;
  Parser *this_00;
  char *pcVar20;
  _Alloc_hider _Var21;
  pointer ppEVar22;
  char *in_R8;
  bool bVar23;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar24;
  pair<std::_Rb_tree_iterator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_bool>
  pVar25;
  string qualified_name;
  EnumDef *enum_def;
  set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
  union_types;
  EnumValBuilder evb;
  string enum_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enum_comment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  EnumDef *local_178;
  undefined1 local_170 [32];
  _Base_ptr local_150;
  size_t local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  BaseType local_fc;
  undefined1 local_f8 [8];
  undefined8 local_f0 [2];
  pointer local_e0 [2];
  char *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,is_union);
  cVar6 = (char)dest;
  __x = &(this_00->super_ParserState).doc_comment_;
  local_d0 = filename;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__x);
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00127925;
  local_f0[0] = local_e0;
  pcVar3 = (this_00->super_ParserState).attribute_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar3,
             pcVar3 + (this_00->super_ParserState).attribute_._M_string_length);
  t = (int)this_00;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    StartEnum(this,(string *)this_00,SUB81(local_f0,0),(EnumDef **)((ulong)dest & 0xff));
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      if ((in_R8 != (char *)0x0) && ((this_00->opts).project_root._M_string_length != 0)) {
        local_140._0_8_ = local_130;
        strlen(in_R8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_140);
        FilePath((string *)local_170,&(this_00->opts).project_root,(string *)local_140,
                 (this_00->opts).binary_schema_absolute_paths);
        pVar24 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&this_00->string_cache_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_170);
        (local_178->super_Definition).declaration_file =
             (string *)(pVar24.first._M_node._M_node + 1);
        if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
        if ((Parser *)local_140._0_8_ != (Parser *)local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(local_178->super_Definition).doc_comment,&local_48);
      if ((this_00->opts).proto_mode == false) {
        if ((this_00->super_ParserState).token_ != 0x3a) {
          if (cVar6 != '\0') goto LAB_00126ca6;
          local_170._0_8_ = local_170 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "must specify the underlying integer type for this enum (e.g. \': short\', which was the default)."
                     ,"");
          Error(this,(string *)this_00);
          goto LAB_0012736c;
        }
        if ((cVar6 != '\0') && (((this_00->opts).lang_to_generate & 0xfffffffffffffcf7) != 0)) {
          local_170._0_8_ = local_170 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Underlying type for union is not yet supported in at least one of the specified programming languages."
                     ,"");
          Error(this,(string *)this_00);
          goto LAB_0012736c;
        }
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00127900;
        ParseType(this,(Type *)this_00);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00127900;
        BVar9 = (local_178->underlying_type).base_type;
        if (BVar9 != BASE_TYPE_BOOL && 0xfffffff5 < BVar9 - BASE_TYPE_FLOAT) {
          (local_178->underlying_type).enum_def = local_178;
          goto LAB_00126ca6;
        }
        pcVar20 = "enum";
        if (cVar6 != '\0') {
          pcVar20 = "union";
        }
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,pcVar20,
                   (char *)((long)((ulong)dest & 0xff) + (long)(pcVar20 + 4)));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,"underlying ",&local_198);
        plVar14 = (long *)std::__cxx11::string::append(local_140);
        psVar16 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_170._16_8_ = *psVar16;
          local_170._24_8_ = plVar14[3];
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_170 + 0x10);
        }
        else {
          local_170._16_8_ = *psVar16;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_170._8_8_ = plVar14[1];
        *plVar14 = (long)psVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        Error(this,(string *)this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_170 + 0x10)) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
        if ((Parser *)local_140._0_8_ != (Parser *)local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
        }
        _Var21._M_p = local_198._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_00127900;
      }
      else {
LAB_00126ca6:
        ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)this_00);
        pEVar7 = local_178;
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00127900;
        local_fc = (local_178->underlying_type).base_type;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_170 + 0x10);
        local_170._0_8_ = paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"bit_flags","");
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                         *)&(pEVar7->super_Definition).attributes,(key_type *)local_170);
        if (((_Rb_tree_header *)cVar10._M_node ==
             &(pEVar7->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) ||
           (*(long *)(cVar10._M_node + 2) == 0)) {
LAB_00126d76:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._0_8_ != paVar1) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
        }
        else {
          bVar23 = local_fc < BASE_TYPE_FLOAT;
          bVar15 = (byte)local_fc;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._0_8_ != paVar1) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
          if (((byte)(0x552 >> (bVar15 & 0x1f)) & bVar23) == 0) {
            local_170._0_8_ = paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_170,"underlying type of bit_flags enum must be unsigned","");
            Warning(this_00,(string *)local_170);
            goto LAB_00126d76;
          }
        }
        pEVar7 = local_178;
        local_170._0_8_ = paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"force_align","");
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                         *)&(pEVar7->super_Definition).attributes,(key_type *)local_170);
        if ((_Rb_tree_header *)cVar10._M_node ==
            &(pEVar7->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
          bVar23 = true;
        }
        else {
          bVar23 = *(long *)(cVar10._M_node + 2) == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != paVar1) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
        if (bVar23) {
          local_140._8_8_ = local_178;
          local_130._0_8_ = (char *)0x0;
          local_130[8] = '\0';
          local_140._0_8_ = this_00;
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            if (((cVar6 != '\0') || ((this_00->super_ParserState).token_ == 0x7d)) &&
               ((this_00->opts).proto_mode == false)) {
              local_170._0_8_ = paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"NONE","");
              EnumValBuilder::CreateEnumerator((EnumValBuilder *)local_140,(string *)local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._0_8_ != paVar1) {
                operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
              }
              EnumValBuilder::AcceptEnumerator((EnumValBuilder *)this,(string *)local_140);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278f6;
            }
            local_f8 = (undefined1  [8])&(this_00->super_ParserState).attribute_;
            local_170._24_8_ = local_170 + 8;
            local_170._8_8_ = local_170._8_8_ & 0xffffffff00000000;
            local_170._16_8_ = 0;
            local_148 = 0;
            local_150 = (_Base_ptr)local_170._24_8_;
            do {
              if ((this_00->super_ParserState).token_ == 0x7d) {
LAB_00127398:
                Expect(this,t);
                pEVar7 = local_178;
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  if ((local_178->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      (local_178->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_198,"incomplete enum declaration, values not found",
                               "");
                    Error(this,(string *)this_00);
                    goto LAB_001278d1;
                  }
                  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_198,"bit_flags","");
                  cVar10 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                   *)&(pEVar7->super_Definition).attributes,&local_198);
                  if ((_Rb_tree_header *)cVar10._M_node ==
                      &(pEVar7->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header
                     ) {
                    bVar23 = true;
                  }
                  else {
                    bVar23 = *(long *)(cVar10._M_node + 2) == 0;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._M_dataplus._M_p != &local_198.field_2) {
                    operator_delete(local_198._M_dataplus._M_p,
                                    local_198.field_2._M_allocated_capacity + 1);
                  }
                  BVar9 = local_fc;
                  if (bVar23) goto LAB_0012758c;
                  sVar13 = SizeOf(local_fc);
                  ppEVar19 = (local_178->vals).vec.
                             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  ppEVar22 = (local_178->vals).vec.
                             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  if (ppEVar19 == ppEVar22) goto LAB_0012758c;
                  goto LAB_0012751d;
                }
                break;
              }
              if (((this_00->opts).proto_mode == true) &&
                 (iVar8 = std::__cxx11::string::compare((char *)local_f8), iVar8 == 0)) {
                ParseProtoOption(this);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                cVar2 = *(char *)&(this->super_ParserState).prev_cursor_;
              }
              else {
                pEVar11 = EnumValBuilder::CreateEnumerator
                                    ((EnumValBuilder *)local_140,(string *)local_f8);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                pcVar3 = (pEVar11->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_198,pcVar3,pcVar3 + (pEVar11->name)._M_string_length);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=(&pEVar11->doc_comment,__x);
                Expect(this,t);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                if (cVar6 != '\0') {
                  ParseNamespacing(this,(string *)this_00,&local_198);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                  if ((this_00->opts).union_value_namespacing == true) {
                    std::__cxx11::string::_M_assign((string *)pEVar11);
                    sVar4 = (pEVar11->name)._M_string_length;
                    if (sVar4 != 0) {
                      pcVar3 = (pEVar11->name)._M_dataplus._M_p;
                      sVar18 = 0;
                      do {
                        if (pcVar3[sVar18] == '.') {
                          pcVar3[sVar18] = '_';
                        }
                        sVar18 = sVar18 + 1;
                      } while (sVar4 != sVar18);
                    }
                  }
                  if ((this_00->super_ParserState).token_ == 0x3a) {
                    Next(this);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                    ParseType(this,(Type *)this_00);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                    BVar9 = (pEVar11->union_type).base_type;
                    if ((BVar9 | BASE_TYPE_BOOL) != BASE_TYPE_STRUCT) {
                      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)(local_130 + 0x10),
                                 "union value type may only be table/struct/string","");
                      Error(this,(string *)this_00);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_120._M_dataplus._M_p == &local_120.field_2) goto LAB_001278d1;
                      goto LAB_0012770f;
                    }
                  }
                  else {
                    pSVar12 = LookupCreateStruct(this_00,&local_198,true,false);
                    (pEVar11->union_type).base_type = BASE_TYPE_STRUCT;
                    (pEVar11->union_type).element = BASE_TYPE_NONE;
                    (pEVar11->union_type).struct_def = pSVar12;
                    (pEVar11->union_type).enum_def = (EnumDef *)0x0;
                    (pEVar11->union_type).fixed_length = 0;
                    BVar9 = BASE_TYPE_STRUCT;
                  }
                  if (local_178->uses_multiple_type_instances == false) {
                    local_120._M_string_length = (size_type)(pEVar11->union_type).struct_def;
                    local_120._M_dataplus._M_p._0_4_ = BVar9;
                    pVar25 = std::
                             _Rb_tree<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>,std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>,std::_Identity<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>,std::less<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>,std::allocator<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>>
                             ::
                             _M_insert_unique<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>
                                       ((_Rb_tree<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>,std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>,std::_Identity<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>,std::less<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>,std::allocator<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>>
                                         *)local_170,
                                        (pair<flatbuffers::BaseType,_flatbuffers::StructDef_*> *)
                                        (local_130 + 0x10));
                    local_178->uses_multiple_type_instances = (bool)(~pVar25.second & 1);
                  }
                }
                iVar8 = (this_00->super_ParserState).token_;
                if (iVar8 == 0x3d) {
                  Next(this);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                  EnumValBuilder::AssignEnumeratorValue((EnumValBuilder *)this,(string *)local_140);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                  Expect(this,t);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                  iVar8 = (this_00->super_ParserState).token_;
                }
                if (((this_00->opts).proto_mode == true) && (iVar8 == 0x5b)) {
                  Next(this);
                  while( true ) {
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                    if ((this_00->super_ParserState).token_ == 0x5d) break;
                    Next(this);
                  }
                  Next(this);
                }
                else {
                  ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)this_00);
                }
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001278d1;
                EnumValBuilder::AcceptEnumerator((EnumValBuilder *)this,(string *)local_140);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                cVar2 = *(char *)&(this->super_ParserState).prev_cursor_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
              }
              if (cVar2 != '\0') break;
              iVar8 = 0x2c;
              if ((this_00->opts).proto_mode != false) {
                iVar8 = 0x3b;
              }
              if ((this_00->super_ParserState).token_ != iVar8) goto LAB_00127398;
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            } while (*(char *)&(this->super_ParserState).prev_cursor_ == '\0');
            goto LAB_001278ec;
          }
          goto LAB_001278f6;
        }
        local_170._0_8_ = paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"`force_align` is not a valid attribute for Enums. ","");
        Error(this,(string *)this_00);
LAB_0012736c:
        local_198.field_2._M_allocated_capacity = local_170._16_8_;
        _Var21._M_p = (pointer)local_170._0_8_;
        if ((undefined1 *)local_170._0_8_ == local_170 + 0x10) goto LAB_00127900;
      }
      operator_delete(_Var21._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00127900:
  if ((pointer *)local_f0[0] != local_e0) {
    operator_delete((void *)local_f0[0],(ulong)((long)&(local_e0[0]->_M_dataplus)._M_p + 1));
  }
LAB_00127925:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return SUB82(this,0);
  while( true ) {
    if (sVar13 * 8 <= uVar5) {
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"bit flag out of range of underlying integral type","");
      Error(this,(string *)this_00);
      goto LAB_001278d1;
    }
    (*ppEVar19)->value = 1L << ((byte)uVar5 & 0x3f);
    ppEVar19 = ppEVar19 + 1;
    if (ppEVar19 == ppEVar22) break;
LAB_0012751d:
    uVar5 = (*ppEVar19)->value;
    if (((BASE_TYPE_ULONG < BVar9) ||
        ((0x552U >> (BVar9 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) == 0)) &&
       (uVar5 == sVar13 * 8 - 1)) {
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"underlying type of bit_flags enum must be unsigned","");
      Error(this,(string *)this_00);
      goto LAB_001278d1;
    }
  }
LAB_0012758c:
  EnumDef::SortByValue(local_178);
  ppEVar19 = (local_178->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar22 = ppEVar19;
LAB_001275a8:
  ppEVar22 = ppEVar22 + 1;
  if (ppEVar22 !=
      (local_178->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto code_r0x001275ad;
  if (local_d0 != (char *)0x0) {
    *(EnumDef **)local_d0 = local_178;
  }
  Namespace::GetFullyQualifiedName(&local_198,this_00->current_namespace_,(string *)local_178,1000);
  e = (Type *)operator_new(0x20);
  e->base_type = BASE_TYPE_UNION;
  e->element = BASE_TYPE_NONE;
  e->struct_def = (StructDef *)0x0;
  e->enum_def = local_178;
  e->fixed_length = 0;
  bVar23 = SymbolTable<flatbuffers::Type>::Add(&this_00->types_,&local_198,e);
  if (bVar23) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_130 + 0x10),"datatype already exists: ",&local_198);
    Error(this,(string *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_0012770f:
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_001278d1:
  local_88.field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
  local_88._M_dataplus._M_p = local_198._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) goto LAB_001278e4;
  goto LAB_001278ec;
code_r0x001275ad:
  pEVar11 = *ppEVar19;
  __rhs = *ppEVar22;
  if (pEVar11->value == __rhs->value) goto LAB_001275c8;
  goto LAB_001275a8;
LAB_001275c8:
  std::operator+(&local_88,"all enum values must be unique: ",&pEVar11->name);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar17 = plVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar17) {
    local_c8.field_2._M_allocated_capacity = *plVar17;
    local_c8.field_2._8_8_ = plVar14[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *plVar17;
    local_c8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c8._M_string_length = plVar14[1];
  *plVar14 = (long)plVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_c8,&__rhs->name);
  plVar14 = (long *)std::__cxx11::string::append(local_68);
  psVar16 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_120.field_2._M_allocated_capacity = *psVar16;
    local_120.field_2._8_8_ = plVar14[3];
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar16;
    local_120._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_120._M_string_length = plVar14[1];
  *plVar14 = (long)psVar16;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  NumToString<long>(&local_a8,__rhs->value);
  std::operator+(&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_130 + 0x10),&local_a8);
  Error(this,(string *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_001278e4:
    operator_delete(local_88._M_dataplus._M_p,
                    (ulong)((long)&((_Base_ptr)local_88.field_2._M_allocated_capacity)->_M_color + 1
                           ));
  }
LAB_001278ec:
  std::
  _Rb_tree<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::_Identity<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::_Identity<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
               *)local_170);
LAB_001278f6:
  EnumValBuilder::~EnumValBuilder((EnumValBuilder *)local_140);
  goto LAB_00127900;
}

Assistant:

CheckedError Parser::ParseEnum(const bool is_union, EnumDef **dest,
                               const char *filename) {
  std::vector<std::string> enum_comment = doc_comment_;
  NEXT();
  std::string enum_name = attribute_;
  EXPECT(kTokenIdentifier);
  EnumDef *enum_def;
  ECHECK(StartEnum(enum_name, is_union, &enum_def));
  if (filename != nullptr && !opts.project_root.empty()) {
    enum_def->declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  enum_def->doc_comment = enum_comment;
  if (!opts.proto_mode) {
    // Give specialized error message, since this type spec used to
    // be optional in the first FlatBuffers release.
    bool explicit_underlying_type = false;
    if (!Is(':')) {
      // Enum is forced to have an explicit underlying type in declaration.
      if (!is_union) {
        return Error(
            "must specify the underlying integer type for this"
            " enum (e.g. \': short\', which was the default).");
      }
    } else {
      // Union underlying type is only supported for cpp
      if (is_union && !SupportsUnionUnderlyingType()) {
        return Error(
            "Underlying type for union is not yet supported in at least one of "
            "the specified programming languages.");
      }
      NEXT();
      explicit_underlying_type = true;
    }

    if (explicit_underlying_type) {
      // Specify the integer type underlying this enum.
      ECHECK(ParseType(enum_def->underlying_type));
      if (!IsInteger(enum_def->underlying_type.base_type) || IsBool(enum_def->underlying_type.base_type)) {
        return Error("underlying " + std::string(is_union ? "union" : "enum") + "type must be integral");
      }
        
      // Make this type refer back to the enum it was derived from.
      enum_def->underlying_type.enum_def = enum_def;
    }

  }
  ECHECK(ParseMetaData(&enum_def->attributes));
  const auto underlying_type = enum_def->underlying_type.base_type;
  if (enum_def->attributes.Lookup("bit_flags") &&
      !IsUnsigned(underlying_type)) {
    // todo: Convert to the Error in the future?
    Warning("underlying type of bit_flags enum must be unsigned");
  }
  if (enum_def->attributes.Lookup("force_align")) {
    return Error("`force_align` is not a valid attribute for Enums. ");
  }
  EnumValBuilder evb(*this, *enum_def);
  EXPECT('{');
  // A lot of code generatos expect that an enum is not-empty.
  if ((is_union || Is('}')) && !opts.proto_mode) {
    evb.CreateEnumerator("NONE");
    ECHECK(evb.AcceptEnumerator());
  }
  std::set<std::pair<BaseType, StructDef *>> union_types;
  while (!Is('}')) {
    if (opts.proto_mode && attribute_ == "option") {
      ECHECK(ParseProtoOption());
    } else {
      auto &ev = *evb.CreateEnumerator(attribute_);
      auto full_name = ev.name;
      ev.doc_comment = doc_comment_;
      EXPECT(kTokenIdentifier);
      if (is_union) {
        ECHECK(ParseNamespacing(&full_name, &ev.name));
        if (opts.union_value_namespacing) {
          // Since we can't namespace the actual enum identifiers, turn
          // namespace parts into part of the identifier.
          ev.name = full_name;
          std::replace(ev.name.begin(), ev.name.end(), '.', '_');
        }
        if (Is(':')) {
          NEXT();
          ECHECK(ParseType(ev.union_type));
          if (ev.union_type.base_type != BASE_TYPE_STRUCT &&
              ev.union_type.base_type != BASE_TYPE_STRING)
            return Error("union value type may only be table/struct/string");
        } else {
          ev.union_type = Type(BASE_TYPE_STRUCT, LookupCreateStruct(full_name));
        }
        if (!enum_def->uses_multiple_type_instances) {
          auto ins = union_types.insert(std::make_pair(
              ev.union_type.base_type, ev.union_type.struct_def));
          enum_def->uses_multiple_type_instances = (false == ins.second);
        }
      }

      if (Is('=')) {
        NEXT();
        ECHECK(evb.AssignEnumeratorValue(attribute_));
        EXPECT(kTokenIntegerConstant);
      }

      if (opts.proto_mode && Is('[')) {
        NEXT();
        // ignore attributes on enums.
        while (token_ != ']') NEXT();
        NEXT();
      } else {
        // parse attributes in fbs schema
        ECHECK(ParseMetaData(&ev.attributes));
      }

      ECHECK(evb.AcceptEnumerator());
    }
    if (!Is(opts.proto_mode ? ';' : ',')) break;
    NEXT();
  }
  EXPECT('}');

  // At this point, the enum can be empty if input is invalid proto-file.
  if (!enum_def->size())
    return Error("incomplete enum declaration, values not found");

  if (enum_def->attributes.Lookup("bit_flags")) {
    const auto base_width = static_cast<uint64_t>(8 * SizeOf(underlying_type));
    for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
         ++it) {
      auto ev = *it;
      const auto u = ev->GetAsUInt64();
      // Stop manipulations with the sign.
      if (!IsUnsigned(underlying_type) && u == (base_width - 1))
        return Error("underlying type of bit_flags enum must be unsigned");
      if (u >= base_width)
        return Error("bit flag out of range of underlying integral type");
      enum_def->ChangeEnumValue(ev, 1ULL << u);
    }
  }

  enum_def->SortByValue();  // Must be sorted to use MinValue/MaxValue.

  // Ensure enum value uniqueness.
  auto prev_it = enum_def->Vals().begin();
  for (auto it = prev_it + 1; it != enum_def->Vals().end(); ++it) {
    auto prev_ev = *prev_it;
    auto ev = *it;
    if (prev_ev->GetAsUInt64() == ev->GetAsUInt64())
      return Error("all enum values must be unique: " + prev_ev->name +
                   " and " + ev->name + " are both " +
                   NumToString(ev->GetAsInt64()));
  }

  if (dest) *dest = enum_def;
  const auto qualified_name =
      current_namespace_->GetFullyQualifiedName(enum_def->name);
  if (types_.Add(qualified_name, new Type(BASE_TYPE_UNION, nullptr, enum_def)))
    return Error("datatype already exists: " + qualified_name);
  return NoError();
}